

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

bool sanityCheck(QMdiSubWindow *child,char *where)

{
  if (child == (QMdiSubWindow *)0x0) {
    sanityCheck();
  }
  return child != (QMdiSubWindow *)0x0;
}

Assistant:

static bool sanityCheck(const QMdiSubWindow * const child, const char *where)
{
    if (Q_UNLIKELY(!child)) {
        const char error[] = "null pointer";
        Q_ASSERT_X(false, where, error);
        qWarning("%s:%s", where, error);
        return false;
    }
    return true;
}